

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O0

REF_STATUS ref_swap_edge_mixed(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  uint uVar1;
  byte local_49;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL hex_side;
  REF_BOOL pyr_side;
  REF_BOOL pri_side;
  REF_BOOL qua_side;
  REF_BOOL *allowed_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  _pri_side = (uint *)allowed;
  allowed_local._0_4_ = node1;
  allowed_local._4_4_ = node0;
  _node1_local = ref_grid;
  uVar1 = ref_cell_has_side(ref_grid->cell[6],node0,node1,&pyr_side);
  if (uVar1 == 0) {
    uVar1 = ref_cell_has_side(_node1_local->cell[10],allowed_local._4_4_,(REF_INT)allowed_local,
                              &hex_side);
    if (uVar1 == 0) {
      uVar1 = ref_cell_has_side(_node1_local->cell[9],allowed_local._4_4_,(REF_INT)allowed_local,
                                &ref_private_macro_code_rss);
      if (uVar1 == 0) {
        ref_grid_local._4_4_ =
             ref_cell_has_side(_node1_local->cell[0xb],allowed_local._4_4_,(REF_INT)allowed_local,
                               &ref_private_macro_code_rss_1);
        if (ref_grid_local._4_4_ == 0) {
          local_49 = 0;
          if (((pyr_side == 0) && (local_49 = 0, hex_side == 0)) &&
             (local_49 = 0, ref_private_macro_code_rss == 0)) {
            local_49 = ref_private_macro_code_rss_1 != 0 ^ 0xff;
          }
          *_pri_side = (uint)(local_49 & 1);
          ref_grid_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 0x2d1,"ref_swap_edge_mixed",(ulong)ref_grid_local._4_4_,"hex");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
               0x2cf,"ref_swap_edge_mixed",(ulong)uVar1,"pyr");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x2cd,
             "ref_swap_edge_mixed",(ulong)uVar1,"pri");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x2cb,
           "ref_swap_edge_mixed",(ulong)uVar1,"qua");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_swap_edge_mixed(REF_GRID ref_grid, REF_INT node0,
                                              REF_INT node1,
                                              REF_BOOL *allowed) {
  REF_BOOL qua_side, pri_side, pyr_side, hex_side;

  RSS(ref_cell_has_side(ref_grid_qua(ref_grid), node0, node1, &qua_side),
      "qua");
  RSS(ref_cell_has_side(ref_grid_pri(ref_grid), node0, node1, &pri_side),
      "pri");
  RSS(ref_cell_has_side(ref_grid_pyr(ref_grid), node0, node1, &pyr_side),
      "pyr");
  RSS(ref_cell_has_side(ref_grid_hex(ref_grid), node0, node1, &hex_side),
      "hex");

  *allowed = (!qua_side && !pri_side && !pyr_side && !hex_side);

  return REF_SUCCESS;
}